

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_53d0eb::TestPresetOptionalFilterIncludeIndexHelper
               (optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out,
               Value *value,cmJSONState *state)

{
  bool bVar1;
  IndexOptions *pIVar2;
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::operator=(out);
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::emplace<>
                ((optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *)
                 value_local);
      Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
      pIVar2 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
               operator->((optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *
                          )value_local);
      std::__cxx11::string::operator=((string *)&pIVar2->IndexFile,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      out_local._7_1_ = true;
    }
    else {
      bVar1 = Json::Value::isObject((Value *)state_local);
      if (bVar1) {
        out_local._7_1_ =
             std::
             function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
             ::operator()((function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
                           *)(anonymous_namespace)::TestPresetOptionalFilterIncludeIndexObjectHelper
                          ,(optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            *)value_local,(Value *)state_local,local_28);
      }
      else {
        out_local._7_1_ = false;
      }
    }
  }
  return out_local._7_1_;
}

Assistant:

bool TestPresetOptionalFilterIncludeIndexHelper(
  cm::optional<TestPreset::IncludeOptions::IndexOptions>& out,
  const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (value->isString()) {
    out.emplace();
    out->IndexFile = value->asString();
    return true;
  }

  if (value->isObject()) {
    return TestPresetOptionalFilterIncludeIndexObjectHelper(out, value, state);
  }

  return false;
}